

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupAndConesLimit2_rec(Gia_Man_t *pNew,Gia_Man_t *p,int iObj,int Level)

{
  int iLit0;
  int iLit1;
  uint uVar1;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p,iObj);
  if (pObj->Value == 0xffffffff) {
    if (((Level < 1) || (uVar1 = (uint)*(ulong *)pObj, (*(ulong *)pObj & 0x80000000) != 0)) ||
       ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      uVar1 = Gia_ManAppendCi(pNew);
    }
    else {
      Gia_ManDupAndConesLimit2_rec(pNew,p,iObj - (uVar1 & 0x1fffffff),Level + -1);
      Gia_ManDupAndConesLimit2_rec
                (pNew,p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),Level + -1);
      iLit0 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar1 = Gia_ManAppendAnd(pNew,iLit0,iLit1);
    }
    pObj->Value = uVar1;
  }
  return;
}

Assistant:

void Gia_ManDupAndConesLimit2_rec( Gia_Man_t * pNew, Gia_Man_t * p, int iObj, int Level )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( ~pObj->Value )
        return;
    if ( !Gia_ObjIsAnd(pObj) || Level <= 0 )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        //printf( "PI %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
        return;
    }
    Gia_ManDupAndConesLimit2_rec( pNew, p, Gia_ObjFaninId0(pObj, iObj), Level-1 );
    Gia_ManDupAndConesLimit2_rec( pNew, p, Gia_ObjFaninId1(pObj, iObj), Level-1 );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    //printf( "Obj %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
}